

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSubdivSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,float tessellationRate,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppuVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  undefined8 uVar5;
  Node *pNVar6;
  int iVar7;
  SubdivMeshNode *this_00;
  Vec3fa *pVVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  iterator iVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  uint p11;
  uint p10;
  uint p00;
  uint p11_1;
  float phif;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  SubdivMeshNode *local_b8;
  float local_b0;
  float local_ac;
  ulong local_a8;
  ulong local_a0;
  float local_98;
  float local_94;
  ulong local_90;
  int local_88;
  float local_84;
  size_t local_80;
  ulong local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  ulong local_68;
  Ref<embree::SceneGraph::MaterialNode> local_60;
  float local_54;
  uint local_50;
  uint local_4c;
  Node *local_48;
  ulong local_40;
  ulong local_38;
  
  local_a0 = CONCAT44(local_a0._4_4_,tessellationRate);
  local_94 = radius;
  local_80 = N;
  this_00 = (SubdivMeshNode *)operator_new(0x1b0);
  local_60 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  local_b8 = this_00;
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SubdivMeshNode::SubdivMeshNode(this_00,&local_60,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_48 = (Node *)this;
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar18 = (int)local_80 * 2;
  local_a8 = (ulong)uVar18;
  this_00->tessellationRate = (float)local_a0;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (ulong)(((int)local_80 + 1) * uVar18);
  uVar14 = pvVar4->size_alloced;
  uVar13 = uVar14;
  if ((uVar14 < uVar16) && (uVar13 = uVar16, uVar12 = uVar14, uVar14 != 0)) {
    do {
      uVar13 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
      uVar12 = uVar13;
    } while (uVar13 < uVar16);
  }
  if (uVar16 < pvVar4->size_active) {
    pvVar4->size_active = uVar16;
  }
  if (uVar14 == uVar13) {
    pvVar4->size_active = uVar16;
  }
  else {
    ptr = pvVar4->items;
    pVVar8 = (Vec3fa *)alignedMalloc(uVar13 << 4,0x10);
    pvVar4->items = pVVar8;
    if (pvVar4->size_active != 0) {
      lVar17 = 0;
      uVar14 = 0;
      do {
        puVar2 = (undefined8 *)((long)&ptr->field_0 + lVar17);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar17);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        uVar14 = uVar14 + 1;
        lVar17 = lVar17 + 0x10;
      } while (uVar14 < pvVar4->size_active);
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar16;
    pvVar4->size_alloced = uVar13;
  }
  uVar13 = local_a8 & 0xffffffff;
  fVar19 = (float)uVar13;
  auVar20 = rcpss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  local_84 = (2.0 - fVar19 * auVar20._0_4_) * auVar20._0_4_;
  fVar19 = (float)(local_80 & 0xffffffff);
  auVar20 = rcpss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  local_54 = (2.0 - fVar19 * auVar20._0_4_) * auVar20._0_4_;
  iVar9 = (int)local_a8;
  local_40 = (ulong)(iVar9 - 1);
  local_70 = &local_b8->verticesPerFace;
  local_b8 = (SubdivMeshNode *)&local_b8->position_indices;
  local_50 = iVar9 * (int)local_80;
  local_38 = (ulong)(uint)(((int)local_80 + -1) * iVar9);
  local_78 = (ulong)(uint)-iVar9;
  local_88 = 0;
  lVar17 = 0;
  uVar14 = 0;
  local_68 = local_78;
  do {
    local_90 = uVar14;
    if ((int)local_a8 != 0) {
      local_a0 = CONCAT44(local_a0._4_4_,(float)uVar14 * 3.1415927 * local_54);
      uVar14 = 0;
      do {
        local_ac = ((float)(uVar14 & 0xffffffff) + (float)(uVar14 & 0xffffffff)) * 3.1415927 *
                   local_84;
        local_b0 = (center->field_0).m128[0];
        local_98 = sinf((float)local_a0);
        local_98 = local_98 * local_94;
        fVar19 = sinf(local_ac);
        uVar18 = (int)lVar17 + (int)uVar14;
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[0] =
             fVar19 * local_98 + local_b0;
        local_b0 = (center->field_0).m128[1];
        fVar19 = cosf((float)local_a0);
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[1] =
             fVar19 * local_94 + local_b0;
        local_b0 = (center->field_0).m128[2];
        local_98 = sinf((float)local_a0);
        local_98 = local_98 * local_94;
        fVar19 = cosf(local_ac);
        ((this_00->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[2] =
             fVar19 * local_98 + local_b0;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    if ((int)local_90 != 0) {
      uVar18 = (uint)local_40;
      if ((int)local_90 == 1) {
        if ((uint)local_a8 != 0) {
          iVar9 = 1;
          do {
            local_c4 = uVar18 + iVar9;
            iVar7 = iVar9;
            if ((int)local_78 + iVar9 == 0) {
              iVar7 = 0;
            }
            local_c8 = iVar7 + (uint)local_a8;
            local_bc = 3;
            iVar15._M_current =
                 (this_00->verticesPerFace).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_c0 = uVar18;
            if (iVar15._M_current ==
                (this_00->verticesPerFace).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_70,iVar15,&local_bc);
            }
            else {
              *iVar15._M_current = 3;
              ppuVar1 = &(this_00->verticesPerFace).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (this_00->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                         &local_c4);
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            }
            else {
              *iVar15._M_current = local_c4;
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar15._M_current;
            }
            if (iVar15._M_current ==
                (this_00->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                         &local_c0);
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            }
            else {
              *iVar15._M_current = local_c0;
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar15._M_current;
            }
            if (iVar15._M_current ==
                (this_00->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                         &local_c8);
            }
            else {
              *iVar15._M_current = local_c8;
              ppuVar1 = &(this_00->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar7 = (int)local_78 + iVar9;
            iVar9 = iVar9 + 1;
          } while (iVar7 != 0);
        }
      }
      else if ((int)local_90 == (uint)local_80) {
        if ((uint)local_a8 != 0) {
          iVar9 = 1;
          do {
            local_c0 = ((int)local_38 + iVar9) - 1;
            iVar7 = iVar9;
            if ((int)local_78 + iVar9 == 0) {
              iVar7 = 0;
            }
            local_c4 = iVar7 + (int)local_38;
            local_c8 = local_50;
            local_bc = 3;
            iVar15._M_current =
                 (this_00->verticesPerFace).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (this_00->verticesPerFace).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_70,iVar15,&local_bc);
            }
            else {
              *iVar15._M_current = 3;
              ppuVar1 = &(this_00->verticesPerFace).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (this_00->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                         &local_c8);
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            }
            else {
              *iVar15._M_current = local_c8;
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar15._M_current;
            }
            if (iVar15._M_current ==
                (this_00->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                         &local_c0);
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            }
            else {
              *iVar15._M_current = local_c0;
              iVar15._M_current =
                   (this_00->position_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar15._M_current;
            }
            if (iVar15._M_current ==
                (this_00->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                         &local_c4);
            }
            else {
              *iVar15._M_current = local_c4;
              ppuVar1 = &(this_00->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar7 = (int)local_78 + iVar9;
            iVar9 = iVar9 + 1;
          } while (iVar7 != 0);
        }
      }
      else if ((uint)local_a8 != 0) {
        local_a0 = (ulong)(((int)local_90 + -1) * (uint)local_a8);
        local_ac = (float)((int)local_90 * (uint)local_a8);
        uVar10 = 0;
        do {
          uVar11 = uVar10 + 1;
          local_c0 = (int)local_68 + uVar10;
          local_bc = uVar11;
          if (uVar18 == uVar10) {
            local_bc = 0;
          }
          local_c4 = (int)local_a0 + local_bc;
          local_c8 = uVar10 + local_88;
          local_bc = local_bc + (int)local_ac;
          local_4c = 4;
          iVar15._M_current =
               (this_00->verticesPerFace).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (this_00->verticesPerFace).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_70,iVar15,&local_4c);
          }
          else {
            *iVar15._M_current = 4;
            ppuVar1 = &(this_00->verticesPerFace).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          iVar15._M_current =
               (this_00->position_indices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                       &local_c8);
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            *iVar15._M_current = local_c8;
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (this_00->position_indices).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar15._M_current;
          }
          if (iVar15._M_current ==
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                       &local_c0);
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            *iVar15._M_current = local_c0;
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (this_00->position_indices).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar15._M_current;
          }
          if (iVar15._M_current ==
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                       &local_c4);
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            *iVar15._M_current = local_c4;
            iVar15._M_current =
                 (this_00->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (this_00->position_indices).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar15._M_current;
          }
          if (iVar15._M_current ==
              (this_00->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iVar15,
                       &local_bc);
          }
          else {
            *iVar15._M_current = local_bc;
            ppuVar1 = &(this_00->position_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          uVar10 = uVar11;
        } while ((uint)local_a8 != uVar11);
      }
    }
    pNVar6 = local_48;
    uVar18 = (int)local_90 + 1;
    uVar14 = (ulong)uVar18;
    lVar17 = lVar17 + uVar13;
    local_68 = (ulong)(uint)((int)local_68 + (int)local_a8);
    local_88 = local_88 + (int)local_a8;
  } while (uVar18 <= (uint)local_80);
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar6;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSubdivSphere (const Vec3fa& center, const float radius, size_t N, float tessellationRate, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),1);
    mesh->tessellationRate = tessellationRate;
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp((float)numTheta);
    const float rcpNumPhi   = rcp((float)numPhi);
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p11);
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(4);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
          mesh->position_indices.push_back(p11);
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }